

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemComboBox.cpp
# Opt level: O0

void __thiscall QFileSystemComboBox::setCurrentFileName(QFileSystemComboBox *this,QString *fileName)

{
  bool bVar1;
  QString *in_RSI;
  int in_EDI;
  QString *in_stack_00000078;
  QFileSystemComboBox *in_stack_00000080;
  QFileSystemComboBox *this_00;
  undefined1 local_48 [32];
  QString local_28;
  
  bVar1 = QString::isEmpty(in_RSI);
  if (bVar1) {
    QComboBox::setCurrentIndex(in_EDI);
  }
  else {
    this_00 = (QFileSystemComboBox *)local_48;
    rootPath(this_00);
    QDir::QDir((QDir *)(local_48 + 0x18),(QString *)this_00);
    QDir::filePath(&local_28);
    setCurrentFilePath(in_stack_00000080,in_stack_00000078);
    QString::~QString((QString *)0x2220c0);
    QDir::~QDir((QDir *)(local_48 + 0x18));
    QString::~QString((QString *)0x2220d4);
  }
  return;
}

Assistant:

void QFileSystemComboBox::setCurrentFileName(const QString &fileName) {
    if (fileName.isEmpty()) {
        setCurrentIndex(-1);
    } else {
        setCurrentFilePath(QDir(rootPath()).filePath(fileName));
    }
}